

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalcrules.cpp
# Opt level: O0

void applycalcrule_stepped(profile_rec_new *profile,LossRec *x,int layer,bool isLast)

{
  bool bVar1;
  reference ptVar2;
  float fVar3;
  float local_31c;
  OASIS_FLOAT debrisloss;
  OASIS_FLOAT condloss_7;
  OASIS_FLOAT trigger;
  OASIS_FLOAT loss_11;
  tc_rec y_10;
  const_iterator __end2_10;
  const_iterator __begin2_10;
  vector<tc_rec,_std::allocator<tc_rec>_> *__range2_10;
  float local_2e8;
  OASIS_FLOAT limit2_7;
  OASIS_FLOAT scale2_7;
  OASIS_FLOAT scale1_7;
  OASIS_FLOAT tend_6;
  OASIS_FLOAT tstart_7;
  OASIS_FLOAT condloss_6;
  OASIS_FLOAT loss_10;
  tc_rec y_9;
  const_iterator __end2_9;
  const_iterator __begin2_9;
  vector<tc_rec,_std::allocator<tc_rec>_> *__range2_9;
  OASIS_FLOAT limit2_6;
  OASIS_FLOAT limit1_3;
  OASIS_FLOAT scale2_6;
  OASIS_FLOAT scale1_6;
  OASIS_FLOAT payout_6;
  OASIS_FLOAT tend_5;
  OASIS_FLOAT tstart_6;
  OASIS_FLOAT deductible1_5;
  OASIS_FLOAT net_loss_2;
  OASIS_FLOAT loss_9;
  tc_rec y_8;
  const_iterator __end2_8;
  const_iterator __begin2_8;
  vector<tc_rec,_std::allocator<tc_rec>_> *__range2_8;
  float local_260;
  OASIS_FLOAT att_1;
  OASIS_FLOAT share_1;
  OASIS_FLOAT ded_1;
  OASIS_FLOAT condloss_5;
  OASIS_FLOAT loss_8;
  tc_rec y_7;
  const_iterator __end2_7;
  const_iterator __begin2_7;
  vector<tc_rec,_std::allocator<tc_rec>_> *__range2_7;
  OASIS_FLOAT limit2_5;
  OASIS_FLOAT scale2_5;
  OASIS_FLOAT limit1_2;
  OASIS_FLOAT scale1_5;
  OASIS_FLOAT payout_5;
  OASIS_FLOAT tstart_5;
  OASIS_FLOAT condloss_4;
  OASIS_FLOAT loss_7;
  tc_rec y_6;
  const_iterator __end2_6;
  const_iterator __begin2_6;
  vector<tc_rec,_std::allocator<tc_rec>_> *__range2_6;
  float local_1e8;
  OASIS_FLOAT limit2_4;
  OASIS_FLOAT scale2_4;
  OASIS_FLOAT scale1_4;
  OASIS_FLOAT payout_4;
  OASIS_FLOAT tend_4;
  OASIS_FLOAT tstart_4;
  OASIS_FLOAT deductible1_4;
  OASIS_FLOAT condloss_3;
  OASIS_FLOAT loss_6;
  tc_rec y_5;
  const_iterator __end2_5;
  const_iterator __begin2_5;
  vector<tc_rec,_std::allocator<tc_rec>_> *__range2_5;
  OASIS_FLOAT limit2_3;
  OASIS_FLOAT limit1_1;
  OASIS_FLOAT scale2_3;
  OASIS_FLOAT scale1_3;
  OASIS_FLOAT payout_3;
  OASIS_FLOAT tend_3;
  OASIS_FLOAT tstart_3;
  OASIS_FLOAT deductible1_3;
  OASIS_FLOAT condloss_2;
  OASIS_FLOAT loss_5;
  tc_rec y_4;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  vector<tc_rec,_std::allocator<tc_rec>_> *__range2_4;
  float local_158;
  OASIS_FLOAT limit2_2;
  OASIS_FLOAT scale2_2;
  OASIS_FLOAT scale1_2;
  OASIS_FLOAT payout_2;
  OASIS_FLOAT tend_2;
  OASIS_FLOAT tstart_2;
  OASIS_FLOAT deductible1_2;
  OASIS_FLOAT condloss_1;
  OASIS_FLOAT loss_4;
  tc_rec y_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<tc_rec,_std::allocator<tc_rec>_> *__range2_3;
  float local_110;
  OASIS_FLOAT limit2_1;
  OASIS_FLOAT scale2_1;
  OASIS_FLOAT scale1_1;
  OASIS_FLOAT payout_1;
  OASIS_FLOAT tend_1;
  OASIS_FLOAT tstart_1;
  OASIS_FLOAT deductible1_1;
  OASIS_FLOAT condloss;
  OASIS_FLOAT loss_3;
  tc_rec y_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<tc_rec,_std::allocator<tc_rec>_> *__range2_2;
  float local_c8;
  OASIS_FLOAT limit2;
  OASIS_FLOAT limit1;
  OASIS_FLOAT scale2;
  OASIS_FLOAT scale1;
  OASIS_FLOAT payout;
  OASIS_FLOAT tend;
  OASIS_FLOAT tstart;
  OASIS_FLOAT deductible1;
  OASIS_FLOAT net_loss_1;
  OASIS_FLOAT under_limit;
  OASIS_FLOAT loss_2;
  tc_rec y_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<tc_rec,_std::allocator<tc_rec>_> *__range2_1;
  OASIS_FLOAT lim_1;
  OASIS_FLOAT loss_1;
  tc_rec *z;
  const_iterator __end3;
  const_iterator __begin3;
  vector<tc_rec,_std::allocator<tc_rec>_> *__range3;
  OASIS_FLOAT net_loss;
  OASIS_FLOAT loss;
  tc_rec y;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tc_rec,_std::allocator<tc_rec>_> *__range2;
  OASIS_FLOAT att;
  OASIS_FLOAT share;
  OASIS_FLOAT lim;
  OASIS_FLOAT ded;
  bool isLast_local;
  int layer_local;
  LossRec *x_local;
  profile_rec_new *profile_local;
  
  switch(profile->calcrule_id) {
  case 2:
    share = 0.0;
    att = 0.0;
    __range2._4_4_ = 0.0;
    __range2._0_4_ = 0.0;
    __end2 = std::vector<tc_rec,_std::allocator<tc_rec>_>::begin(&profile->tc_vec);
    y = (tc_rec)std::vector<tc_rec,_std::allocator<tc_rec>_>::end(&profile->tc_vec);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>
                                       *)&y), bVar1) {
      ptVar2 = __gnu_cxx::
               __normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
               operator*(&__end2);
      loss._0_1_ = (*ptVar2).tc_id;
      net_loss = (*ptVar2).tc_val;
      if (loss._0_1_ == '\0') {
        share = net_loss;
      }
      if (loss._0_1_ == '\x04') {
        att = net_loss;
      }
      if (loss._0_1_ == '\x06') {
        __range2._4_4_ = net_loss;
      }
      if (loss._0_1_ == '\x03') {
        __range2._0_4_ = net_loss;
      }
      __gnu_cxx::__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
      operator++(&__end2);
    }
    __range3._4_4_ = x->loss - share;
    if (__range3._4_4_ < 0.0) {
      __range3._4_4_ = 0.0;
    }
    x->effective_deductible = x->effective_deductible + (x->loss - __range3._4_4_);
    if (__range3._4_4_ <= __range2._0_4_ + att) {
      __range3._4_4_ = __range3._4_4_ - __range2._0_4_;
    }
    else {
      __range3._4_4_ = att;
    }
    if (__range3._4_4_ < 0.0) {
      __range3._4_4_ = 0.0;
    }
    fVar3 = __range3._4_4_ * __range2._4_4_;
    if (layer < 2) {
      __range3._0_4_ = x->retained_loss + (x->loss - fVar3);
    }
    else {
      __range3._0_4_ = x->previous_layer_retained_loss - fVar3;
    }
    x->retained_loss = __range3._0_4_;
    x->loss = fVar3;
    break;
  default:
    fprintf(_stderr,"FATAL: Unknown calc rule %d\n",(ulong)(uint)profile->calcrule_id);
    break;
  case 0xc:
    if (0.0 < x->loss) {
      __end3 = std::vector<tc_rec,_std::allocator<tc_rec>_>::begin(&profile->tc_vec);
      z = (tc_rec *)std::vector<tc_rec,_std::allocator<tc_rec>_>::end(&profile->tc_vec);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>
                                         *)&z), bVar1) {
        ptVar2 = __gnu_cxx::
                 __normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
                 operator*(&__end3);
        if (ptVar2->tc_id == '\0') {
          __range2_1._4_4_ = x->loss - ptVar2->tc_val;
          if (__range2_1._4_4_ < 0.0) {
            __range2_1._4_4_ = 0.0;
          }
          x->effective_deductible = x->effective_deductible + (x->loss - __range2_1._4_4_);
          if (x->under_limit <= x->effective_deductible && x->effective_deductible != x->under_limit
             ) {
            x->under_limit = x->effective_deductible;
          }
          x->retained_loss = x->retained_loss + (x->loss - __range2_1._4_4_);
          x->loss = __range2_1._4_4_;
          return;
        }
        __gnu_cxx::__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>
        ::operator++(&__end3);
      }
    }
    break;
  case 0xe:
    __range2_1._0_4_ = 0.0;
    __end2_1 = std::vector<tc_rec,_std::allocator<tc_rec>_>::begin(&profile->tc_vec);
    y_1 = (tc_rec)std::vector<tc_rec,_std::allocator<tc_rec>_>::end(&profile->tc_vec);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>
                               *)&y_1), bVar1) {
      ptVar2 = __gnu_cxx::
               __normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
               operator*(&__end2_1);
      loss_2._0_1_ = (*ptVar2).tc_id;
      if (loss_2._0_1_ == '\x04') {
        under_limit = (*ptVar2).tc_val;
        __range2_1._0_4_ = under_limit;
      }
      __gnu_cxx::__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
      operator++(&__end2_1);
    }
    net_loss_1 = x->loss;
    if (__range2_1._0_4_ < net_loss_1) {
      x->over_limit = net_loss_1 - __range2_1._0_4_;
      net_loss_1 = __range2_1._0_4_;
    }
    deductible1 = x->under_limit;
    if (deductible1 < x->effective_deductible) {
      deductible1 = x->effective_deductible;
    }
    if (__range2_1._0_4_ - net_loss_1 < deductible1) {
      deductible1 = __range2_1._0_4_ - net_loss_1;
    }
    x->under_limit = deductible1;
    if (layer < 2) {
      tstart = x->retained_loss + (x->loss - net_loss_1);
    }
    else {
      tstart = x->previous_layer_retained_loss - net_loss_1;
    }
    x->retained_loss = tstart;
    x->loss = net_loss_1;
    break;
  case 0x1b:
    tend = 0.0;
    payout = 0.0;
    scale1 = 0.0;
    scale2 = 0.0;
    limit1 = 0.0;
    limit2 = 0.0;
    local_c8 = 0.0;
    __range2_2._4_4_ = 0.0;
    __end2_2 = std::vector<tc_rec,_std::allocator<tc_rec>_>::begin(&profile->tc_vec);
    y_2 = (tc_rec)std::vector<tc_rec,_std::allocator<tc_rec>_>::end(&profile->tc_vec);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>
                               *)&y_2), bVar1) {
      ptVar2 = __gnu_cxx::
               __normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
               operator*(&__end2_2);
      loss_3._0_1_ = (*ptVar2).tc_id;
      condloss = (*ptVar2).tc_val;
      if (loss_3._0_1_ == '\0') {
        tend = condloss;
      }
      if (loss_3._0_1_ == '\t') {
        payout = condloss;
      }
      if (loss_3._0_1_ == '\n') {
        scale1 = condloss;
      }
      if (loss_3._0_1_ == '\v') {
        scale2 = condloss;
      }
      if (loss_3._0_1_ == '\r') {
        limit1 = condloss;
      }
      if (loss_3._0_1_ == '\x0e') {
        limit2 = condloss;
      }
      if (loss_3._0_1_ == '\x04') {
        local_c8 = condloss;
      }
      if (loss_3._0_1_ == '\x05') {
        __range2_2._4_4_ = condloss;
      }
      __gnu_cxx::__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
      operator++(&__end2_2);
    }
    fVar3 = x->loss / x->accumulated_tiv;
    if ((scale1 != 1.0) || (NAN(scale1))) {
      if (scale1 <= fVar3) {
        deductible1_1 = 0.0;
      }
      else if (fVar3 < payout) {
        deductible1_1 = 0.0;
      }
      else {
        deductible1_1 = scale2 * x->accumulated_tiv + -tend;
        if (deductible1_1 < 0.0) {
          deductible1_1 = 0.0;
        }
        if (local_c8 < deductible1_1) {
          deductible1_1 = local_c8;
        }
        tstart_1 = deductible1_1 * limit2;
        if (__range2_2._4_4_ < tstart_1) {
          tstart_1 = __range2_2._4_4_;
        }
        deductible1_1 = (deductible1_1 + tstart_1) * (limit1 + 1.0);
      }
    }
    else if (fVar3 < payout) {
      deductible1_1 = 0.0;
    }
    else {
      deductible1_1 = scale2 * x->accumulated_tiv + -tend;
      if (deductible1_1 < 0.0) {
        deductible1_1 = 0.0;
      }
      if (local_c8 < deductible1_1) {
        deductible1_1 = local_c8;
      }
      tstart_1 = deductible1_1 * limit2;
      if (__range2_2._4_4_ < tstart_1) {
        tstart_1 = __range2_2._4_4_;
      }
      deductible1_1 = (deductible1_1 + tstart_1) * (limit1 + 1.0);
    }
    if (profile->step_id == 1) {
      x->step_loss = deductible1_1;
    }
    else {
      x->step_loss = x->step_loss + deductible1_1;
    }
    if (isLast) {
      x->loss = x->step_loss;
    }
    break;
  case 0x1c:
    tend_1 = 0.0;
    payout_1 = 0.0;
    scale1_1 = 0.0;
    scale2_1 = 0.0;
    limit2_1 = 0.0;
    local_110 = 0.0;
    __range2_3._4_4_ = 0.0;
    __end2_3 = std::vector<tc_rec,_std::allocator<tc_rec>_>::begin(&profile->tc_vec);
    y_3 = (tc_rec)std::vector<tc_rec,_std::allocator<tc_rec>_>::end(&profile->tc_vec);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>
                               *)&y_3), bVar1) {
      ptVar2 = __gnu_cxx::
               __normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
               operator*(&__end2_3);
      loss_4._0_1_ = (*ptVar2).tc_id;
      condloss_1 = (*ptVar2).tc_val;
      if (loss_4._0_1_ == '\0') {
        tend_1 = condloss_1;
      }
      if (loss_4._0_1_ == '\t') {
        payout_1 = condloss_1;
      }
      if (loss_4._0_1_ == '\n') {
        scale1_1 = condloss_1;
      }
      if (loss_4._0_1_ == '\v') {
        scale2_1 = condloss_1;
      }
      if (loss_4._0_1_ == '\r') {
        limit2_1 = condloss_1;
      }
      if (loss_4._0_1_ == '\x0e') {
        local_110 = condloss_1;
      }
      if (loss_4._0_1_ == '\x05') {
        __range2_3._4_4_ = condloss_1;
      }
      __gnu_cxx::__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
      operator++(&__end2_3);
    }
    fVar3 = x->loss / x->accumulated_tiv;
    if ((scale1_1 != 1.0) || (NAN(scale1_1))) {
      if (scale1_1 <= fVar3) {
        deductible1_2 = 0.0;
      }
      else if (fVar3 < payout_1) {
        deductible1_2 = 0.0;
      }
      else {
        deductible1_2 = scale2_1 * x->loss + -tend_1;
        if (deductible1_2 < 0.0) {
          deductible1_2 = 0.0;
        }
        tstart_2 = deductible1_2 * local_110;
        if (__range2_3._4_4_ < tstart_2) {
          tstart_2 = __range2_3._4_4_;
        }
        deductible1_2 = (deductible1_2 + tstart_2) * (limit2_1 + 1.0);
      }
    }
    else if (fVar3 < payout_1) {
      deductible1_2 = 0.0;
    }
    else {
      deductible1_2 = scale2_1 * x->loss + -tend_1;
      if (deductible1_2 < 0.0) {
        deductible1_2 = 0.0;
      }
      tstart_2 = deductible1_2 * local_110;
      if (__range2_3._4_4_ < tstart_2) {
        tstart_2 = __range2_3._4_4_;
      }
      deductible1_2 = (deductible1_2 + tstart_2) * (limit2_1 + 1.0);
    }
    if (profile->step_id == 1) {
      x->step_loss = deductible1_2;
    }
    else {
      x->step_loss = x->step_loss + deductible1_2;
    }
    if (isLast) {
      x->loss = x->step_loss;
    }
    break;
  case 0x1d:
    tend_2 = 0.0;
    payout_2 = 0.0;
    scale1_2 = 0.0;
    scale2_2 = 0.0;
    limit2_2 = 0.0;
    local_158 = 0.0;
    __range2_4._4_4_ = 0.0;
    __end2_4 = std::vector<tc_rec,_std::allocator<tc_rec>_>::begin(&profile->tc_vec);
    y_4 = (tc_rec)std::vector<tc_rec,_std::allocator<tc_rec>_>::end(&profile->tc_vec);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_4,
                              (__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>
                               *)&y_4), bVar1) {
      ptVar2 = __gnu_cxx::
               __normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
               operator*(&__end2_4);
      loss_5._0_1_ = (*ptVar2).tc_id;
      condloss_2 = (*ptVar2).tc_val;
      if (loss_5._0_1_ == '\0') {
        tend_2 = condloss_2;
      }
      if (loss_5._0_1_ == '\t') {
        payout_2 = condloss_2;
      }
      if (loss_5._0_1_ == '\n') {
        scale1_2 = condloss_2;
      }
      if (loss_5._0_1_ == '\v') {
        scale2_2 = condloss_2;
      }
      if (loss_5._0_1_ == '\r') {
        limit2_2 = condloss_2;
      }
      if (loss_5._0_1_ == '\x0e') {
        local_158 = condloss_2;
      }
      if (loss_5._0_1_ == '\x05') {
        __range2_4._4_4_ = condloss_2;
      }
      __gnu_cxx::__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
      operator++(&__end2_4);
    }
    fVar3 = x->loss / x->accumulated_tiv;
    if ((scale1_2 != 1.0) || (NAN(scale1_2))) {
      if (scale1_2 <= fVar3) {
        deductible1_3 = 0.0;
      }
      else if (fVar3 < payout_2) {
        deductible1_3 = 0.0;
      }
      else {
        deductible1_3 = scale2_2 * x->accumulated_tiv + -tend_2;
        if (deductible1_3 < 0.0) {
          deductible1_3 = 0.0;
        }
        tstart_3 = deductible1_3 * local_158;
        if (__range2_4._4_4_ < tstart_3) {
          tstart_3 = __range2_4._4_4_;
        }
        deductible1_3 = (deductible1_3 + tstart_3) * (limit2_2 + 1.0);
      }
    }
    else if (fVar3 < payout_2) {
      deductible1_3 = 0.0;
    }
    else {
      deductible1_3 = scale2_2 * x->accumulated_tiv + -tend_2;
      if (deductible1_3 < 0.0) {
        deductible1_3 = 0.0;
      }
      tstart_3 = deductible1_3 * local_158;
      if (__range2_4._4_4_ < tstart_3) {
        tstart_3 = __range2_4._4_4_;
      }
      deductible1_3 = (deductible1_3 + tstart_3) * (limit2_2 + 1.0);
    }
    if (profile->step_id == 1) {
      x->step_loss = deductible1_3;
    }
    else {
      x->step_loss = x->step_loss + deductible1_3;
    }
    if (isLast) {
      x->loss = x->step_loss;
    }
    break;
  case 0x1e:
    tend_3 = 0.0;
    payout_3 = 0.0;
    scale1_3 = 0.0;
    scale2_3 = 0.0;
    limit1_1 = 0.0;
    limit2_3 = 0.0;
    __range2_5._4_4_ = 0.0;
    __range2_5._0_4_ = 0.0;
    __end2_5 = std::vector<tc_rec,_std::allocator<tc_rec>_>::begin(&profile->tc_vec);
    y_5 = (tc_rec)std::vector<tc_rec,_std::allocator<tc_rec>_>::end(&profile->tc_vec);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_5,
                              (__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>
                               *)&y_5), bVar1) {
      ptVar2 = __gnu_cxx::
               __normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
               operator*(&__end2_5);
      loss_6._0_1_ = (*ptVar2).tc_id;
      condloss_3 = (*ptVar2).tc_val;
      if (loss_6._0_1_ == '\0') {
        tend_3 = condloss_3;
      }
      if (loss_6._0_1_ == '\t') {
        payout_3 = condloss_3;
      }
      if (loss_6._0_1_ == '\n') {
        scale1_3 = condloss_3;
      }
      if (loss_6._0_1_ == '\v') {
        scale2_3 = condloss_3;
      }
      if (loss_6._0_1_ == '\r') {
        limit1_1 = condloss_3;
      }
      if (loss_6._0_1_ == '\x0e') {
        limit2_3 = condloss_3;
      }
      if (loss_6._0_1_ == '\x04') {
        __range2_5._4_4_ = condloss_3;
      }
      if (loss_6._0_1_ == '\x05') {
        __range2_5._0_4_ = condloss_3;
      }
      __gnu_cxx::__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
      operator++(&__end2_5);
    }
    fVar3 = x->loss / x->accumulated_tiv;
    if ((scale1_3 != 1.0) || (NAN(scale1_3))) {
      if (scale1_3 <= fVar3) {
        deductible1_4 = 0.0;
      }
      else if (fVar3 < payout_3) {
        deductible1_4 = 0.0;
      }
      else {
        deductible1_4 = scale2_3 * __range2_5._4_4_ + -tend_3;
        if (deductible1_4 < 0.0) {
          deductible1_4 = 0.0;
        }
        tstart_4 = deductible1_4 * limit2_3;
        if (__range2_5._0_4_ < tstart_4) {
          tstart_4 = __range2_5._0_4_;
        }
        deductible1_4 = (deductible1_4 + tstart_4) * (limit1_1 + 1.0);
      }
    }
    else if (fVar3 < payout_3) {
      deductible1_4 = 0.0;
    }
    else {
      deductible1_4 = scale2_3 * __range2_5._4_4_ + -tend_3;
      if (deductible1_4 < 0.0) {
        deductible1_4 = 0.0;
      }
      tstart_4 = deductible1_4 * limit2_3;
      if (__range2_5._0_4_ < tstart_4) {
        tstart_4 = __range2_5._0_4_;
      }
      deductible1_4 = (deductible1_4 + tstart_4) * (limit1_1 + 1.0);
    }
    if (profile->step_id == 1) {
      x->step_loss = deductible1_4;
    }
    else {
      x->step_loss = x->step_loss + deductible1_4;
    }
    if (isLast) {
      x->loss = x->step_loss;
    }
    break;
  case 0x1f:
    tend_4 = 0.0;
    payout_4 = 0.0;
    scale1_4 = 0.0;
    scale2_4 = 0.0;
    limit2_4 = 0.0;
    local_1e8 = 0.0;
    __range2_6._4_4_ = 0.0;
    __end2_6 = std::vector<tc_rec,_std::allocator<tc_rec>_>::begin(&profile->tc_vec);
    y_6 = (tc_rec)std::vector<tc_rec,_std::allocator<tc_rec>_>::end(&profile->tc_vec);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_6,
                              (__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>
                               *)&y_6), bVar1) {
      ptVar2 = __gnu_cxx::
               __normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
               operator*(&__end2_6);
      loss_7._0_1_ = (*ptVar2).tc_id;
      condloss_4 = (*ptVar2).tc_val;
      if (loss_7._0_1_ == '\0') {
        tend_4 = condloss_4;
      }
      if (loss_7._0_1_ == '\t') {
        payout_4 = condloss_4;
      }
      if (loss_7._0_1_ == '\n') {
        scale1_4 = condloss_4;
      }
      if (loss_7._0_1_ == '\v') {
        scale2_4 = condloss_4;
      }
      if (loss_7._0_1_ == '\r') {
        limit2_4 = condloss_4;
      }
      if (loss_7._0_1_ == '\x0e') {
        local_1e8 = condloss_4;
      }
      if (loss_7._0_1_ == '\x05') {
        __range2_6._4_4_ = condloss_4;
      }
      __gnu_cxx::__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
      operator++(&__end2_6);
    }
    fVar3 = x->loss / x->accumulated_tiv;
    if ((scale1_4 != 1.0) || (NAN(scale1_4))) {
      if (scale1_4 <= fVar3) {
        tstart_5 = 0.0;
      }
      else if (fVar3 < payout_4) {
        tstart_5 = 0.0;
      }
      else {
        tstart_5 = scale2_4 - tend_4;
        if (tstart_5 < 0.0) {
          tstart_5 = 0.0;
        }
        payout_5 = tstart_5 * local_1e8;
        if (__range2_6._4_4_ < payout_5) {
          payout_5 = __range2_6._4_4_;
        }
        tstart_5 = (tstart_5 + payout_5) * (limit2_4 + 1.0);
      }
    }
    else if (fVar3 < payout_4) {
      tstart_5 = 0.0;
    }
    else {
      tstart_5 = scale2_4 - tend_4;
      if (tstart_5 < 0.0) {
        tstart_5 = 0.0;
      }
      payout_5 = tstart_5 * local_1e8;
      if (__range2_6._4_4_ < payout_5) {
        payout_5 = __range2_6._4_4_;
      }
      tstart_5 = (tstart_5 + payout_5) * (limit2_4 + 1.0);
    }
    if (profile->step_id == 1) {
      x->step_loss = tstart_5;
    }
    else {
      x->step_loss = x->step_loss + tstart_5;
    }
    if (isLast) {
      x->loss = x->step_loss;
    }
    break;
  case 0x20:
    scale1_5 = 0.0;
    limit1_2 = 0.0;
    scale2_5 = 0.0;
    limit2_5 = 0.0;
    __range2_7._4_4_ = 0.0;
    __range2_7._0_4_ = 0.0;
    __end2_7 = std::vector<tc_rec,_std::allocator<tc_rec>_>::begin(&profile->tc_vec);
    y_7 = (tc_rec)std::vector<tc_rec,_std::allocator<tc_rec>_>::end(&profile->tc_vec);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_7,
                              (__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>
                               *)&y_7), bVar1) {
      ptVar2 = __gnu_cxx::
               __normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
               operator*(&__end2_7);
      loss_8._0_1_ = (*ptVar2).tc_id;
      condloss_5 = (*ptVar2).tc_val;
      if (loss_8._0_1_ == '\t') {
        scale1_5 = condloss_5;
      }
      if (loss_8._0_1_ == '\v') {
        limit1_2 = condloss_5;
      }
      if (loss_8._0_1_ == '\r') {
        scale2_5 = condloss_5;
      }
      if (loss_8._0_1_ == '\x04') {
        limit2_5 = condloss_5;
      }
      if (loss_8._0_1_ == '\x0e') {
        __range2_7._4_4_ = condloss_5;
      }
      if (loss_8._0_1_ == '\x05') {
        __range2_7._0_4_ = condloss_5;
      }
      __gnu_cxx::__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
      operator++(&__end2_7);
    }
    if (x->loss < scale1_5) {
      ded_1 = 0.0;
    }
    else {
      ded_1 = limit1_2 * x->loss;
      if (limit2_5 < ded_1) {
        ded_1 = limit2_5;
      }
      share_1 = ded_1 * __range2_7._4_4_;
      if (__range2_7._0_4_ < share_1) {
        share_1 = __range2_7._0_4_;
      }
      ded_1 = (ded_1 + share_1) * (scale2_5 + 1.0);
    }
    if (profile->step_id == 1) {
      x->step_loss = ded_1;
    }
    else {
      x->step_loss = x->step_loss + ded_1;
    }
    if (isLast) {
      x->loss = x->step_loss;
    }
    break;
  case 0x22:
    att_1 = 0.0;
    local_260 = 0.0;
    __range2_8._4_4_ = 0.0;
    __end2_8 = std::vector<tc_rec,_std::allocator<tc_rec>_>::begin(&profile->tc_vec);
    y_8 = (tc_rec)std::vector<tc_rec,_std::allocator<tc_rec>_>::end(&profile->tc_vec);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_8,
                              (__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>
                               *)&y_8), bVar1) {
      ptVar2 = __gnu_cxx::
               __normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
               operator*(&__end2_8);
      loss_9._0_1_ = (*ptVar2).tc_id;
      net_loss_2 = (*ptVar2).tc_val;
      if (loss_9._0_1_ == '\0') {
        att_1 = net_loss_2;
      }
      if (loss_9._0_1_ == '\x06') {
        local_260 = net_loss_2;
      }
      if (loss_9._0_1_ == '\x03') {
        __range2_8._4_4_ = net_loss_2;
      }
      __gnu_cxx::__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
      operator++(&__end2_8);
    }
    deductible1_5 = x->loss - att_1;
    if (deductible1_5 < 0.0) {
      deductible1_5 = 0.0;
    }
    x->effective_deductible = x->effective_deductible + (x->loss - deductible1_5);
    deductible1_5 = deductible1_5 - __range2_8._4_4_;
    if (deductible1_5 < 0.0) {
      deductible1_5 = 0.0;
    }
    local_260 = deductible1_5 * local_260;
    if (layer < 2) {
      tstart_6 = x->retained_loss + (x->loss - local_260);
    }
    else {
      tstart_6 = x->previous_layer_retained_loss - local_260;
    }
    x->retained_loss = tstart_6;
    x->loss = local_260;
    break;
  case 0x25:
    tend_5 = 0.0;
    payout_6 = 0.0;
    scale1_6 = 0.0;
    scale2_6 = 0.0;
    limit1_3 = 0.0;
    limit2_6 = 0.0;
    __range2_9._4_4_ = 0.0;
    __range2_9._0_4_ = 0.0;
    __end2_9 = std::vector<tc_rec,_std::allocator<tc_rec>_>::begin(&profile->tc_vec);
    y_9 = (tc_rec)std::vector<tc_rec,_std::allocator<tc_rec>_>::end(&profile->tc_vec);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_9,
                              (__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>
                               *)&y_9), bVar1) {
      ptVar2 = __gnu_cxx::
               __normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
               operator*(&__end2_9);
      loss_10._0_1_ = (*ptVar2).tc_id;
      condloss_6 = (*ptVar2).tc_val;
      if (loss_10._0_1_ == '\0') {
        tend_5 = condloss_6;
      }
      if (loss_10._0_1_ == '\t') {
        payout_6 = condloss_6;
      }
      if (loss_10._0_1_ == '\n') {
        scale1_6 = condloss_6;
      }
      if (loss_10._0_1_ == '\v') {
        scale2_6 = condloss_6;
      }
      if (loss_10._0_1_ == '\r') {
        limit1_3 = condloss_6;
      }
      if (loss_10._0_1_ == '\x0e') {
        limit2_6 = condloss_6;
      }
      if (loss_10._0_1_ == '\x04') {
        __range2_9._4_4_ = condloss_6;
      }
      if (loss_10._0_1_ == '\x05') {
        __range2_9._0_4_ = condloss_6;
      }
      __gnu_cxx::__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
      operator++(&__end2_9);
    }
    fVar3 = x->loss / x->accumulated_tiv;
    if ((scale1_6 != 1.0) || (NAN(scale1_6))) {
      if (scale1_6 <= fVar3) {
        tstart_7 = 0.0;
      }
      else if (fVar3 < payout_6) {
        tstart_7 = 0.0;
      }
      else {
        tstart_7 = scale2_6 * x->loss + -tend_5;
        if (tstart_7 < 0.0) {
          tstart_7 = 0.0;
        }
        if (__range2_9._4_4_ < tstart_7) {
          tstart_7 = __range2_9._4_4_;
        }
        tend_6 = tstart_7 * limit2_6;
        if (__range2_9._0_4_ < tend_6) {
          tend_6 = __range2_9._0_4_;
        }
        tstart_7 = (tstart_7 + tend_6) * (limit1_3 + 1.0);
      }
    }
    else if (fVar3 < payout_6) {
      tstart_7 = 0.0;
    }
    else {
      tstart_7 = scale2_6 * x->loss + -tend_5;
      if (tstart_7 < 0.0) {
        tstart_7 = 0.0;
      }
      if (__range2_9._4_4_ < tstart_7) {
        tstart_7 = __range2_9._4_4_;
      }
      tend_6 = tstart_7 * limit2_6;
      if (__range2_9._0_4_ < tend_6) {
        tend_6 = __range2_9._0_4_;
      }
      tstart_7 = (tstart_7 + tend_6) * (limit1_3 + 1.0);
    }
    if (profile->step_id == 1) {
      x->step_loss = tstart_7;
    }
    else {
      x->step_loss = x->step_loss + tstart_7;
    }
    if (isLast) {
      x->loss = x->step_loss;
    }
    break;
  case 0x26:
    scale1_7 = 0.0;
    scale2_7 = 0.0;
    limit2_7 = 0.0;
    local_2e8 = 0.0;
    __range2_10._4_4_ = 0.0;
    __end2_10 = std::vector<tc_rec,_std::allocator<tc_rec>_>::begin(&profile->tc_vec);
    y_10 = (tc_rec)std::vector<tc_rec,_std::allocator<tc_rec>_>::end(&profile->tc_vec);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_10,
                              (__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>
                               *)&y_10), bVar1) {
      ptVar2 = __gnu_cxx::
               __normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
               operator*(&__end2_10);
      loss_11._0_1_ = (*ptVar2).tc_id;
      trigger = (*ptVar2).tc_val;
      if (loss_11._0_1_ == '\t') {
        scale1_7 = trigger;
      }
      if (loss_11._0_1_ == '\n') {
        scale2_7 = trigger;
      }
      if (loss_11._0_1_ == '\r') {
        limit2_7 = trigger;
      }
      if (loss_11._0_1_ == '\x0e') {
        local_2e8 = trigger;
      }
      if (loss_11._0_1_ == '\x05') {
        __range2_10._4_4_ = trigger;
      }
      __gnu_cxx::__normal_iterator<const_tc_rec_*,_std::vector<tc_rec,_std::allocator<tc_rec>_>_>::
      operator++(&__end2_10);
    }
    fVar3 = x->loss / x->accumulated_tiv;
    if ((scale2_7 != 1.0) || (NAN(scale2_7))) {
      if (scale2_7 <= fVar3) {
        condloss_7 = 0.0;
      }
      else if (fVar3 < scale1_7) {
        condloss_7 = 0.0;
      }
      else {
        local_31c = x->step_loss * local_2e8;
        if (__range2_10._4_4_ < local_31c) {
          local_31c = __range2_10._4_4_;
        }
        condloss_7 = local_31c + (x->step_loss + local_31c) * limit2_7;
      }
    }
    else if (fVar3 < scale1_7) {
      condloss_7 = 0.0;
    }
    else {
      local_31c = x->step_loss * local_2e8;
      if (__range2_10._4_4_ < local_31c) {
        local_31c = __range2_10._4_4_;
      }
      condloss_7 = local_31c + (x->step_loss + local_31c) * limit2_7;
    }
    if (profile->step_id == 1) {
      x->step_loss = condloss_7;
    }
    else {
      x->step_loss = x->step_loss + condloss_7;
    }
    if (isLast) {
      x->loss = x->step_loss;
    }
    break;
  case 100:
    x->loss = x->loss;
  }
  return;
}

Assistant:

void applycalcrule_stepped(const profile_rec_new& profile, LossRec& x, int layer,bool isLast)
{
	switch (profile.calcrule_id) {
	case 2:
	{
		OASIS_FLOAT ded = 0;
		OASIS_FLOAT lim = 0;
		OASIS_FLOAT share = 0;
		OASIS_FLOAT att = 0;
		for (auto y : profile.tc_vec) {
			if (y.tc_id == deductible_1) ded = y.tc_val;
			if (y.tc_id == limit_1) lim = y.tc_val;
			if (y.tc_id == share_1) share = y.tc_val;
			if (y.tc_id == attachment_1) att = y.tc_val;
		}
		//Function2: deductible applies before attachment limit share
		//IIf(Loss < Ded, 0, Loss - Ded)
		//IIf(Loss < Att, 0, IIf(Loss > Att + Lim, Lim, Loss - Att)) * Share	
		OASIS_FLOAT loss = 0;
		loss = x.loss - ded;
		if (loss < 0) loss = 0;
		x.effective_deductible = x.effective_deductible + (x.loss - loss);
		if (loss > (att + lim)) loss = lim;
		else loss = loss - att;
		if (loss < 0) loss = 0;
		loss = loss * share;
		//x.retained_loss = x.retained_loss + (x.loss - loss);
		OASIS_FLOAT net_loss = 0;
		if (layer > 1)	net_loss = x.previous_layer_retained_loss - loss;
		else net_loss = x.retained_loss + (x.loss - loss);
		x.retained_loss = net_loss;

		x.loss = loss;
	}
	break;
	case 12:
	{
		if (x.loss > 0) {
			for (auto& z : profile.tc_vec) {
				if (z.tc_id == deductible_1) {
					OASIS_FLOAT loss = x.loss - z.tc_val;
					if (loss < 0) loss = 0;
					x.effective_deductible = x.effective_deductible + (x.loss - loss);
					if (x.effective_deductible > x.under_limit) x.under_limit = x.effective_deductible;
					x.retained_loss = x.retained_loss + (x.loss - loss);
					x.loss = loss;
					break;
				}
			}
		}
	}
	break;
	case 14:
	{
		OASIS_FLOAT lim = 0;
		for (auto y : profile.tc_vec) {
			if (y.tc_id == limit_1) lim = y.tc_val;
		}
		//Function14 =  IIf(Loss > lim, Lim, Loss)
		OASIS_FLOAT loss = x.loss;
			if (loss > lim) {
				x.over_limit = loss - lim;
				loss = lim;
			}
		OASIS_FLOAT under_limit = 0;
		under_limit = x.under_limit;
		if (x.effective_deductible > under_limit) under_limit = x.effective_deductible;
		if (lim - loss < under_limit) under_limit = lim - loss;
		x.under_limit = under_limit;
		//x.retained_loss = x.retained_loss + (x.loss - loss);
		OASIS_FLOAT net_loss = 0;
		if (layer > 1)	net_loss = x.previous_layer_retained_loss - loss;
		else net_loss = x.retained_loss + (x.loss - loss);
		x.retained_loss = net_loss;
		x.loss = loss;
	}
	break;
	case 27:
	{
		OASIS_FLOAT deductible1 = 0;
		OASIS_FLOAT tstart = 0;
		OASIS_FLOAT tend = 0;
		OASIS_FLOAT payout = 0;
		OASIS_FLOAT scale1 = 0;
		OASIS_FLOAT scale2 = 0;
		OASIS_FLOAT limit1 = 0;
		OASIS_FLOAT limit2 = 0;
		for (auto y : profile.tc_vec) {
			if (y.tc_id == deductible_1) deductible1 = y.tc_val;
			if (y.tc_id == trigger_start) tstart = y.tc_val;
			if (y.tc_id == trigger_end) tend = y.tc_val;
			if (y.tc_id == payout_start) payout = y.tc_val;
			if (y.tc_id == scale_1) scale1 = y.tc_val;
			if (y.tc_id == scale_2) scale2 = y.tc_val;
			if (y.tc_id == limit_1) limit1 = y.tc_val;
			if (y.tc_id == limit_2) limit2 = y.tc_val;

		}
		// Step policy: single step with % loss tiv payout and limit, optional deductible, extra expense payout with limit amount, and a gross up factor for debris removal
		OASIS_FLOAT loss = 0;
		OASIS_FLOAT condloss = 0;
		loss = x.loss / x.accumulated_tiv;
		if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
			if (loss >= tstart) {
				loss = (payout * x.accumulated_tiv) - deductible1; //calculate primary payout
				if (loss < 0) loss = 0;
				if (loss > limit1) loss = limit1;
				condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
				if (condloss > limit2) condloss = limit2; //limit conditional payout
				loss = loss + condloss; // main coverage + extra expense payout
				loss = loss * (1 + scale1); // gross up for debris removal
			}
				else loss = 0;
		}
		else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
			if (loss < tend) {
				if (loss >= tstart) {
					loss = (payout * x.accumulated_tiv) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					if (loss > limit1) loss = limit1;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
				else loss = 0;
			}
			else loss = 0;
		}

		if (profile.step_id == 1) {
			x.step_loss = loss;
		}
		else {
			x.step_loss = x.step_loss + loss;
		}
		if (isLast == true) {
			x.loss = x.step_loss;
		}
	}
	break;
		case 28:
		{		
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;
			

			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;				
			}
			// Step policy: single (final) step with % loss payout, no limit, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = (payout * x.loss) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
					else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = (payout * x.loss) - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						condloss = loss * scale2; //calculate conditional payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}
			
			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 29:
		{
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;
			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;

			}
			// Step policy: single step with % loss tiv payout, no limit, optional deductible, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = (payout * x.accumulated_tiv) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
					else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = (payout * x.accumulated_tiv) - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 30:
		{
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit1 = 0;
			OASIS_FLOAT limit2 = 0;
			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_1) limit1 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;

			}
			// Step policy: single step with % limit payout, optional deductible, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = (payout * limit1) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
					else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = (payout * limit1) - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 31:
		{
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;
			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;

			}
			// Step policy: single step with monetary amount payout, optional deductible, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = payout - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
					else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = payout - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 32:
		{
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT limit1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;

			for (auto y : profile.tc_vec) {
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == limit_1) limit1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;
			}
			// Step policy: franchise trigger as a monetary amount with % loss payout, a limit amount and optional extra expenses and scale up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			if (x.loss >= tstart) {
				loss = payout * x.loss;
				if (loss > limit1) loss = limit1;
				condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
				if (condloss > limit2) condloss = limit2; //limit conditional payout
				loss = loss + condloss; // main coverage + extra expense payout
				loss = loss * (1 + scale1);
			}
			else loss = 0;
			
			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}


		}
		break;
		case 34:
		{
			OASIS_FLOAT ded = 0;
			OASIS_FLOAT share = 0;
			OASIS_FLOAT att = 0;
			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) ded = y.tc_val;
				if (y.tc_id == share_1) share = y.tc_val;
				if (y.tc_id == attachment_1) att = y.tc_val;
			}
			//Function2: deductible applies before attachment limit share
			//IIf(Loss < Ded, 0, Loss - Ded)
			//IIf(Loss < Att, 0, IIf(Loss > Att + Lim, Lim, Loss - Att)) * Share	
			OASIS_FLOAT loss = 0;
			loss = x.loss - ded;
			if (loss < 0) loss = 0;
			x.effective_deductible = x.effective_deductible + (x.loss - loss);
			loss = loss - att;
			if (loss < 0) loss = 0;
			loss = loss * share;
			//x.retained_loss = x.retained_loss + (x.loss - loss);
			OASIS_FLOAT net_loss = 0;
			if (layer > 1)	net_loss = x.previous_layer_retained_loss - loss;
			else net_loss = x.retained_loss + (x.loss - loss);
			x.retained_loss = net_loss;
			x.loss = loss;
		}
		break;
		case 37:
		{
			OASIS_FLOAT deductible1 = 0;
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT payout = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit1 = 0;
			OASIS_FLOAT limit2 = 0;


			for (auto y : profile.tc_vec) {
				if (y.tc_id == deductible_1) deductible1 = y.tc_val;
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == payout_start) payout = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_1) limit1 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;
			}
			// Step policy: single (final) step with % loss payout and limit, extra expense payout with limit amount, and a gross up factor for debris removal
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT condloss = 0;
			loss = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (loss >= tstart) {
					loss = (payout * x.loss) - deductible1; //calculate primary payout
					if (loss < 0) loss = 0;
					if (loss > limit1) loss = limit1;
					condloss = loss * scale2; //calculate conditional payout based on primary coverage payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					loss = loss + condloss; // main coverage + extra expense payout
					loss = loss * (1 + scale1); // gross up for debris removal
				}
				else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (loss < tend) {
					if (loss >= tstart) {
						loss = (payout * x.loss) - deductible1; //calculate primary payout
						if (loss < 0) loss = 0;
						if (loss > limit1) loss = limit1;
						condloss = loss * scale2; //calculate conditional payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						loss = loss + condloss; // main coverage + extra expense payout
						loss = loss * (1 + scale1); // gross up for debris removal
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 38:
		{
			OASIS_FLOAT tstart = 0;
			OASIS_FLOAT tend = 0;
			OASIS_FLOAT scale1 = 0;
			OASIS_FLOAT scale2 = 0;
			OASIS_FLOAT limit2 = 0;


			for (auto y : profile.tc_vec) {
				if (y.tc_id == trigger_start) tstart = y.tc_val;
				if (y.tc_id == trigger_end) tend = y.tc_val;
				if (y.tc_id == scale_1) scale1 = y.tc_val;
				if (y.tc_id == scale_2) scale2 = y.tc_val;
				if (y.tc_id == limit_2) limit2 = y.tc_val;
			}
			// Step policy: conditional payouts only, triggered by loss % TIV.  Extra expense payout with limit amount, and a gross up factor for debris removal, with payout based on prior step payout
			OASIS_FLOAT loss = 0;
			OASIS_FLOAT trigger = 0;
			OASIS_FLOAT condloss = 0;
			OASIS_FLOAT debrisloss = 0;
			trigger = x.loss / x.accumulated_tiv;
			if (tend == 1) { // if the upper threshold is 100% then include loss = tend in the conditional calculation
				if (trigger >= tstart) {
					condloss = x.step_loss * scale2; //calculate conditional payout based on prior step payout (extra expenses)
					if (condloss > limit2) condloss = limit2; //limit conditional payout
					debrisloss = (x.step_loss + condloss) * scale1; // debris removal uplift
					loss = condloss + debrisloss; // payout is conditional loss for extra expenses plus full debris removal uplift
				}
				else loss = 0;
			}
			else { // if the upper threshold is not 100% then do not include loss = tend in the conditional calculation
				if (trigger < tend) {
					if (trigger >= tstart) {
						condloss = x.step_loss * scale2; //calculate conditional payout based on prior step payout (extra expenses)
						if (condloss > limit2) condloss = limit2; //limit conditional payout
						debrisloss = (x.step_loss + condloss) * scale1; // debris removal uplift
						loss = condloss + debrisloss; // payout is conditional loss for extra expenses plus full debris removal uplift
					}
					else loss = 0;
				}
				else loss = 0;
			}

			if (profile.step_id == 1) {
				x.step_loss = loss;
			}
			else {
				x.step_loss = x.step_loss + loss;
			}
			if (isLast == true) {
				x.loss = x.step_loss;
			}
		}
		break;
		case 100:	// noop
		{
			x.loss = x.loss;
		}
		break;
		default:
		{
			fprintf(stderr, "FATAL: Unknown calc rule %d\n", profile.calcrule_id);
		}
	}
}